

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_47(QPDF *pdf,char *arg2)

{
  long lVar1;
  ostream *poVar2;
  ulong uVar3;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> labels;
  QPDFPageLabelDocumentHelper pldh;
  long *local_c8;
  long local_c0;
  long local_b8 [2];
  undefined1 local_a8 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  string local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  QPDFPageLabelDocumentHelper local_50;
  
  QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper(&local_50,pdf);
  QPDF::getRoot();
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"/Pages","");
  QPDFObjectHandle::getKey(local_70);
  local_a8._0_8_ = (pointer)(local_a8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"/Count","");
  QPDFObjectHandle::getKey(local_60);
  lVar1 = QPDFObjectHandle::getIntValue();
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_,
                    (ulong)((long)&(((BaseHandle *)local_a8._16_8_)->obj).
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           + 1));
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  QPDFPageLabelDocumentHelper::getLabelsForPageRange((longlong)&local_50,0,lVar1 + -1,(vector *)0x1)
  ;
  if (((int)local_a8._8_8_ - (int)local_a8._0_8_ & 0x10U) == 0) {
    if (local_a8._8_8_ != local_a8._0_8_) {
      uVar3 = 0;
      do {
        QPDFObjectHandle::getIntValue();
        poVar2 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        if ((ulong)((long)(local_a8._8_8_ - local_a8._0_8_) >> 4) <= uVar3 + 1) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          goto LAB_00129b7e;
        }
        QPDFObjectHandle::unparse_abi_cxx11_();
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(char *)local_c8,local_c0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if (local_c8 != local_b8) {
          operator_delete(local_c8,local_b8[0] + 1);
        }
        uVar3 = uVar3 + 2;
      } while (uVar3 < (ulong)((long)(local_a8._8_8_ - local_a8._0_8_) >> 4));
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_a8);
    QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper(&local_50);
    return;
  }
LAB_00129b7e:
  __assert_fail("labels.size() % 2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0x713,"void test_47(QPDF &, const char *)");
}

Assistant:

static void
test_47(QPDF& pdf, char const* arg2)
{
    // Test page labels.
    QPDFPageLabelDocumentHelper pldh(pdf);
    long long npages = pdf.getRoot().getKey("/Pages").getKey("/Count").getIntValue();
    std::vector<QPDFObjectHandle> labels;
    pldh.getLabelsForPageRange(0, npages - 1, 1, labels);
    assert(labels.size() % 2 == 0);
    for (size_t i = 0; i < labels.size(); i += 2) {
        std::cout << labels.at(i).getIntValue() << " " << labels.at(i + 1).unparse() << std::endl;
    }
}